

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# timer.cpp
# Opt level: O0

time_type get_henson_timer(string *name)

{
  bool bVar1;
  string *in_RDI;
  string *in_stack_ffffffffffffff38;
  string local_a0 [32];
  string local_80 [32];
  string *in_stack_ffffffffffffffa0;
  string local_50 [32];
  string local_30 [40];
  time_type local_8;
  
  std::__cxx11::string::string(local_50,in_RDI);
  timer(in_stack_ffffffffffffff38);
  bVar1 = henson::exists(in_stack_ffffffffffffff38);
  std::__cxx11::string::~string(local_30);
  std::__cxx11::string::~string(local_50);
  if (((bVar1 ^ 0xffU) & 1) == 0) {
    std::__cxx11::string::string(local_a0,in_RDI);
    timer(in_stack_ffffffffffffff38);
    local_8 = load_time(in_stack_ffffffffffffffa0);
    std::__cxx11::string::~string(local_80);
    std::__cxx11::string::~string(local_a0);
  }
  else {
    local_8 = 0;
  }
  return local_8;
}

Assistant:

h::time_type    get_henson_timer(std::string name)
{
    if (!henson::exists(timer(name))) return 0;
    return load_time(timer(name));
}